

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::improvementAperture
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  int aperture;
  Plan *pPVar1;
  uint uVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  _Base_ptr *pp_Var6;
  undefined7 in_register_00000009;
  ulong uVar7;
  Plan *pPVar8;
  undefined7 in_register_00000089;
  int iVar9;
  _Base_ptr p_Var10;
  double dVar11;
  _List_node_base *extraout_XMM0_Qb;
  _List_node_base *extraout_XMM0_Qb_00;
  _List_node_base *p_Var12;
  int local_94;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  undefined1 local_78 [16];
  _Base_ptr local_68 [2];
  undefined4 local_58;
  uint local_54;
  _Base_ptr local_50;
  double local_48;
  _List_node_base *p_Stack_40;
  
  local_58 = (undefined4)CONCAT71(in_register_00000089,best_improvement);
  local_80 = (_Base_ptr)0x0;
  local_90._0_8_ = (Plan *)local_90;
  local_90._8_8_ = (Plan *)local_90;
  if ((int)CONCAT71(in_register_00000009,open_beamlet) == 0) {
    pPVar8 = (Plan *)local_78;
    Station::getOpen((vector<int,_std::allocator<int>_> *)pPVar8,station,beamlet);
  }
  else {
    pPVar8 = (Plan *)local_78;
    Station::getClosed((vector<int,_std::allocator<int>_> *)pPVar8,station,beamlet);
  }
  uVar4 = local_78._0_8_;
  if (local_78._8_8_ - local_78._0_8_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[NOPT] ",7);
    dVar11 = c_eval;
  }
  else {
    p_Var10 = (_Base_ptr)((long)(local_78._8_8_ - local_78._0_8_) >> 2);
    iVar5 = rand();
    uVar7 = (ulong)(long)iVar5 % (ulong)p_Var10;
    local_48 = -1.0;
    p_Stack_40 = (_List_node_base *)0x0;
    bVar3 = true;
    iVar5 = 0;
    local_50 = p_Var10;
    do {
      iVar9 = (int)uVar7;
      aperture = *(int *)((long)&((ILS *)uVar4)->_vptr_ILS + (long)iVar9 * 4);
      if (open_beamlet) {
        dVar11 = openBeamlet((ApertureILS *)pPVar8,beamlet,aperture,station,c_eval,P);
        p_Var12 = extraout_XMM0_Qb;
      }
      else {
        dVar11 = closeBeamlet((ApertureILS *)pPVar8,beamlet,0,aperture,station,c_eval,P);
        p_Var12 = extraout_XMM0_Qb_00;
      }
      local_54 = -(uint)(0.0 <= local_48 && local_48 - dVar11 <= 1e-05);
      if ((local_54 & 1) == 0) {
        local_94 = iVar9;
        p_Stack_40 = p_Var12;
        local_48 = dVar11;
      }
      if ((((byte)local_54 | (byte)local_58) & 1) == 0) goto LAB_0012a02d;
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_78,
                 station);
      pPVar8 = (Plan *)local_90._0_8_;
      while (pPVar8 != (Plan *)local_90) {
        pPVar1 = (Plan *)(((_List_impl *)&((ILS *)&pPVar8->_vptr_Plan)->_vptr_ILS)->_M_node).
                         super__List_node_base._M_next;
        operator_delete(pPVar8);
        pPVar8 = pPVar1;
      }
      local_80 = (_Base_ptr)0x0;
      if ((Plan *)local_78._0_8_ == (Plan *)local_78) {
        pp_Var6 = &local_80;
        local_90._0_8_ = (Plan *)local_90;
        local_90._8_8_ = (Plan *)local_90;
      }
      else {
        ((ILS *)&((Plan *)local_78._8_8_)->_vptr_Plan)->_vptr_ILS = (_func_int **)local_90;
        *(Plan **)&(((Plan *)local_78._0_8_)->angle2station)._M_t._M_impl = (Plan *)local_90;
        local_80 = local_68[0];
        pp_Var6 = local_68;
        local_90._0_8_ = local_78._0_8_;
        local_90._8_8_ = local_78._8_8_;
        local_78._0_8_ = (Plan *)local_78;
        local_78._8_8_ = (Plan *)local_78;
      }
      *pp_Var6 = (_Base_ptr)0x0;
      pPVar8 = (Plan *)local_78._0_8_;
      while (pPVar8 != (Plan *)local_78) {
        pPVar1 = (Plan *)((ILS *)&pPVar8->_vptr_Plan)->_vptr_ILS;
        operator_delete(pPVar8);
        pPVar8 = pPVar1;
      }
      if (local_80 != (_Base_ptr)0x0) {
        pPVar8 = P;
        Plan::incremental_eval
                  (P,station,
                   (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   local_90);
      }
      iVar5 = iVar5 + 1;
      if ((local_54 & 1) == 0) {
        iVar5 = 1;
      }
      uVar2 = iVar9 + 1U;
      if (local_50 == (_Base_ptr)(long)(int)(iVar9 + 1U)) {
        uVar2 = 0;
      }
      uVar7 = (ulong)uVar2;
      if (local_50 <= (_Base_ptr)(long)iVar5) {
        bVar3 = false;
      }
    } while (bVar3);
    iVar5 = *(int *)((long)&((ILS *)uVar4)->_vptr_ILS + (long)local_94 * 4);
    if (open_beamlet) {
      dVar11 = openBeamlet((ApertureILS *)pPVar8,beamlet,iVar5,station,c_eval,P);
    }
    else {
      dVar11 = closeBeamlet((ApertureILS *)pPVar8,beamlet,0,iVar5,station,c_eval,P);
    }
  }
LAB_0012a02d:
  pPVar8 = (Plan *)local_90._0_8_;
  if ((Plan *)uVar4 != (Plan *)0x0) {
    operator_delete((void *)uVar4);
    pPVar8 = (Plan *)local_90._0_8_;
  }
  while (pPVar8 != (Plan *)local_90) {
    pPVar1 = (Plan *)((ILS *)&pPVar8->_vptr_Plan)->_vptr_ILS;
    operator_delete(pPVar8);
    pPVar8 = pPVar1;
  }
  return dVar11;
}

Assistant:

double ApertureILS::improvementAperture(int beamlet, Station& station, bool open_beamlet, 
                                             double c_eval, Plan& P, bool best_improvement) {
  double local_best=-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag=true; 
  vector<int> a_list;
  
  if (!open_beamlet) a_list = station.getOpen(beamlet);
  else a_list = station.getClosed(beamlet);
  
  if (a_list.size()<1) {
    cout << "[NOPT] ";
    //cout << endl << "Warning: not possible to make aperture change beamlet:" << beamlet <<endl;
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i = 0;
  
  // Check every aperture 
  while(flag) {
    if (!open_beamlet) {
      aux_eval = closeBeamlet(beamlet, 0, a_list[a], station, c_eval, P); 
    } else {
      aux_eval = openBeamlet(beamlet, a_list[a], station, c_eval, P);
    } 
    
    // First improvement
    if (local_best < 0 || (local_best-aux_eval) >0.00001){
      local_best = aux_eval;
      local_a =a ;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i>=a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    local_best = closeBeamlet(beamlet, 0, a_list[local_a], station, c_eval, P);
  } else{
    local_best = openBeamlet(beamlet, a_list[local_a], station, c_eval, P);
  }
  return(local_best);
  
}